

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O0

void __thiscall re2::PrefilterTree::PrintDebugInfo(PrefilterTree *this,NodeMap *nodes)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  reference pvVar6;
  reference piVar7;
  ostream *poVar8;
  reference ppVar9;
  vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_> *in_RDI;
  const_iterator iter;
  int parent;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *regexps;
  vector<int,_std::allocator<int>_> *parents;
  size_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>_>
  *in_stack_fffffffffffff5b8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffff5c0
  ;
  undefined4 in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d4;
  undefined8 in_stack_fffffffffffff5f0;
  LogMessage *this_00;
  char *in_stack_fffffffffffff5f8;
  LogMessage *in_stack_fffffffffffff600;
  LogMessage local_978;
  iterator local_7f8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>
  local_7f0;
  iterator local_7e8;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>
  local_7e0;
  LogMessage local_7d8;
  LogMessage local_658;
  int local_4d4;
  int *local_4d0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_4c8;
  vector<int,_std::allocator<int>_> *local_4c0;
  LogMessage local_4b8;
  vector<int,_std::allocator<int>_> *local_338;
  vector<int,_std::allocator<int>_> *local_330;
  ulong local_328;
  LogMessage local_320;
  LogMessage local_190;
  
  LogMessage::LogMessage
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
             (int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
  poVar4 = LogMessage::stream(&local_190);
  poVar4 = std::operator<<(poVar4,"#Unique Atoms: ");
  sVar5 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 3));
  std::ostream::operator<<(poVar4,sVar5);
  LogMessage::~LogMessage
            ((LogMessage *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0));
  LogMessage::LogMessage
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
             (int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
  poVar4 = LogMessage::stream(&local_320);
  poVar4 = std::operator<<(poVar4,"#Unique Nodes: ");
  sVar5 = std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::size
                    (in_RDI);
  std::ostream::operator<<(poVar4,sVar5);
  LogMessage::~LogMessage
            ((LogMessage *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0));
  local_328 = 0;
  while( true ) {
    uVar1 = local_328;
    sVar5 = std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::size
                      (in_RDI);
    if (sVar5 <= uVar1) break;
    pvVar6 = std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::
             operator[](in_RDI,local_328);
    local_330 = &pvVar6->parents;
    pvVar6 = std::vector<re2::PrefilterTree::Entry,_std::allocator<re2::PrefilterTree::Entry>_>::
             operator[](in_RDI,local_328);
    local_338 = &pvVar6->regexps;
    LogMessage::LogMessage
              (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
               (int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
    poVar4 = LogMessage::stream(&local_4b8);
    poVar4 = std::operator<<(poVar4,"EntryId: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_328);
    poVar4 = std::operator<<(poVar4," N: ");
    sVar5 = std::vector<int,_std::allocator<int>_>::size(local_330);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
    poVar4 = std::operator<<(poVar4," R: ");
    sVar5 = std::vector<int,_std::allocator<int>_>::size(local_338);
    std::ostream::operator<<(poVar4,sVar5);
    LogMessage::~LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0));
    local_4c0 = local_330;
    local_4c8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5b8);
    local_4d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5b8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffff5c0,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffff5b8);
      if (!bVar2) break;
      piVar7 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_4c8);
      local_4d4 = *piVar7;
      in_stack_fffffffffffff600 = &local_658;
      LogMessage::LogMessage
                (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                 (int)((ulong)in_stack_fffffffffffff5f0 >> 0x20));
      poVar4 = LogMessage::stream(in_stack_fffffffffffff600);
      std::ostream::operator<<(poVar4,local_4d4);
      LogMessage::~LogMessage
                ((LogMessage *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0));
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_4c8);
    }
    local_328 = local_328 + 1;
  }
  this_00 = &local_7d8;
  LogMessage::LogMessage
            (in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,(int)((ulong)this_00 >> 0x20));
  poVar4 = LogMessage::stream(this_00);
  std::operator<<(poVar4,"Map:");
  LogMessage::~LogMessage
            ((LogMessage *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0));
  local_7e8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>_>
       ::begin(in_stack_fffffffffffff5b8);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>
  ::_Rb_tree_const_iterator(&local_7e0,&local_7e8);
  while( true ) {
    local_7f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>_>
         ::end(in_stack_fffffffffffff5b8);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>
    ::_Rb_tree_const_iterator(&local_7f0,&local_7f8);
    bVar2 = std::operator!=(&local_7e0,&local_7f0);
    if (!bVar2) break;
    LogMessage::LogMessage(in_stack_fffffffffffff600,(char *)poVar4,(int)((ulong)this_00 >> 0x20));
    poVar8 = LogMessage::stream(&local_978);
    poVar8 = std::operator<<(poVar8,"NodeId: ");
    ppVar9 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>
                          *)0x1686ab);
    iVar3 = Prefilter::unique_id(ppVar9->second);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
    poVar8 = std::operator<<(poVar8," Str: ");
    ppVar9 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>
                          *)0x1686f4);
    std::operator<<(poVar8,(string *)ppVar9);
    LogMessage::~LogMessage((LogMessage *)CONCAT44(iVar3,in_stack_fffffffffffff5d0));
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_re2::Prefilter_*>_>
                  *)poVar8);
  }
  return;
}

Assistant:

void PrefilterTree::PrintDebugInfo(NodeMap* nodes) {
  LOG(ERROR) << "#Unique Atoms: " << atom_index_to_id_.size();
  LOG(ERROR) << "#Unique Nodes: " << entries_.size();

  for (size_t i = 0; i < entries_.size(); i++) {
    const std::vector<int>& parents = entries_[i].parents;
    const std::vector<int>& regexps = entries_[i].regexps;
    LOG(ERROR) << "EntryId: " << i
               << " N: " << parents.size() << " R: " << regexps.size();
    for (int parent : parents)
      LOG(ERROR) << parent;
  }
  LOG(ERROR) << "Map:";
  for (NodeMap::const_iterator iter = nodes->begin();
       iter != nodes->end(); ++iter)
    LOG(ERROR) << "NodeId: " << (*iter).second->unique_id()
               << " Str: " << (*iter).first;
}